

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::BinaryExpression::fromComponents
          (BinaryExpression *this,Expression *lhs,Expression *rhs,BinaryOperator op,
          SourceLocation opLoc,SourceRange sourceRange,ASTContext *context)

{
  BinaryOperator BVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Compilation *pCVar5;
  Compilation *compilation;
  Type *pTVar6;
  BinaryExpression *expr;
  Diagnostic *diag;
  Diagnostic *diag_00;
  logic_error *this_00;
  undefined4 in_register_0000000c;
  Type *pTVar7;
  Type *forceType;
  Type *forceType_00;
  allocator<char> local_129;
  Compilation *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Type *lt;
  BinaryOperator op_local;
  Expression *local_d0;
  SourceLocation local_c8;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  SourceRange sourceRange_local;
  
  local_c8._4_4_ = in_register_0000000c;
  local_c8._0_4_ = op;
  op_local = (BinaryOperator)rhs;
  sourceRange_local.startLoc = opLoc;
  sourceRange_local.endLoc = (SourceLocation)context;
  pCVar5 = ASTContext::getCompilation((ASTContext *)sourceRange.startLoc);
  compilation = (Compilation *)
                not_null<const_slang::ast::Type_*>::get(&(this->super_Expression).type);
  lt = (Type *)compilation;
  pTVar6 = not_null<const_slang::ast::Type_*>::get(&lhs->type);
  local_128 = pCVar5;
  expr = BumpAllocator::
         emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&pCVar5->super_BumpAllocator,&op_local,(Type *)compilation,
                    &this->super_Expression,lhs,&sourceRange_local);
  bVar2 = Expression::bad(&this->super_Expression);
  pCVar5 = local_128;
  if ((bVar2) || (bVar2 = Expression::bad(lhs), pCVar5 = local_128, bVar2)) goto LAB_0031d882;
  bVar2 = Type::isUnbounded((Type *)compilation);
  if (bVar2) {
    compilation = (Compilation *)local_128->intType;
    lt = (Type *)compilation;
  }
  bVar2 = Type::isUnbounded(pTVar6);
  pCVar5 = local_128;
  if (bVar2) {
    pTVar6 = local_128->intType;
  }
  bVar2 = Type::isIntegral((Type *)compilation);
  if (bVar2) {
    bVar2 = Type::isIntegral(pTVar6);
  }
  else {
    bVar2 = false;
  }
  bVar3 = Type::isNumeric((Type *)compilation);
  if (bVar3) {
    bVar3 = Type::isNumeric(pTVar6);
  }
  else {
    bVar3 = false;
  }
  bVar4 = Expression::isImplicitString(&this->super_Expression);
  if (bVar4) {
    bVar4 = Expression::isImplicitString(lhs);
  }
  else {
    bVar4 = false;
  }
  BVar1 = op_local;
  if (0x1b < (ulong)op_local) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_129);
    std::operator+(&local_80,&local_a0,":");
    std::__cxx11::to_string(&local_c0,0x322);
    std::operator+(&local_60,&local_80,&local_c0);
    std::operator+(&local_100,&local_60,": ");
    std::operator+(&local_120,&local_100,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_120);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pTVar7 = (Type *)((long)&switchD_0031d960::switchdataD_0038abcc +
                   (long)(int)(&switchD_0031d960::switchdataD_0038abcc)[op_local]);
  switch(op_local) {
  case Add:
  case Subtract:
  case Multiply:
    bVar2 = false;
    goto LAB_0031dd73;
  case Divide:
    bVar2 = true;
LAB_0031dd73:
    local_100._M_dataplus._M_p =
         (pointer)Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,bVar2,false);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    break;
  case Mod:
    bVar3 = true;
    goto LAB_0031dd3a;
  case BinaryAnd:
  case BinaryOr:
  case BinaryXor:
  case BinaryXnor:
    bVar3 = false;
LAB_0031dd3a:
    local_100._M_dataplus._M_p =
         (pointer)Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,bVar3,false);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    bVar3 = bVar2;
    break;
  default:
    if (bVar3 != false) {
      if (op_local - Equality < 2) {
        local_100._M_dataplus._M_p =
             (pointer)fromComponents::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)pCVar5,compilation,pTVar6,pTVar7);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
        (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
LAB_0031dc2f:
        pTVar6 = Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,false,false);
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar6,(SourceLocation)0x0);
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar6,(SourceLocation)0x0);
        return &expr->super_Expression;
      }
      if (op_local - CaseEquality < 2) {
        local_100._M_dataplus._M_p = (pointer)pCVar5->bitType;
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
        (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
        goto LAB_0031dc2f;
      }
      bVar3 = Type::isFourState((Type *)compilation);
      local_100._M_dataplus._M_p = (pointer)pCVar5->scalarTypeTable[(ulong)bVar3 + 8];
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
      (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
      pTVar7 = Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,false,false);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar7,(SourceLocation)0x0);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar7,(SourceLocation)0x0);
      bVar3 = bVar2;
      break;
    }
    if (bVar4 == false) {
      bVar2 = Type::isAggregate((Type *)compilation);
      if (((!bVar2) || (bVar2 = Type::isEquivalent((Type *)compilation,pTVar6), !bVar2)) ||
         (bVar2 = Type::isUnpackedUnion((Type *)compilation), bVar2)) {
        bVar2 = Type::isClass((Type *)compilation);
        if ((((bVar2) && (bVar2 = Type::isAssignmentCompatible((Type *)compilation,pTVar6), bVar2))
            || ((bVar2 = Type::isClass(pTVar6), bVar2 &&
                (bVar2 = Type::isAssignmentCompatible(pTVar6,(Type *)compilation), bVar2)))) ||
           (((bVar2 = Type::isCHandle((Type *)compilation), bVar2 ||
             (bVar2 = Type::isNull((Type *)compilation), bVar2)) &&
            ((bVar2 = Type::isCHandle(pTVar6), bVar2 || (bVar2 = Type::isNull(pTVar6), bVar2)))))) {
          local_100._M_dataplus._M_p = (pointer)local_128->bitType;
LAB_0031dfb9:
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
          (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
          return &expr->super_Expression;
        }
        bVar2 = Type::isEvent((Type *)compilation);
        pCVar5 = local_128;
        if (((((bVar2) || (bVar2 = Type::isNull((Type *)compilation), bVar2)) &&
             ((bVar2 = Type::isEvent(pTVar6), bVar2 || (bVar2 = Type::isNull(pTVar6), bVar2)))) ||
            (((bVar2 = Type::isCovergroup((Type *)compilation), bVar2 ||
              (bVar2 = Type::isNull((Type *)compilation), bVar2)) &&
             ((bVar2 = Type::isCovergroup(pTVar6), bVar2 || (bVar2 = Type::isNull(pTVar6), bVar2))))
            )) || (((bVar2 = Type::isVirtualInterface((Type *)compilation), bVar2 &&
                    (bVar2 = Type::isAssignmentCompatible((Type *)compilation,pTVar6), bVar2)) ||
                   ((bVar2 = Type::isVirtualInterface(pTVar6), bVar2 &&
                    (bVar2 = Type::isAssignmentCompatible(pTVar6,(Type *)compilation), bVar2)))))) {
          local_100._M_dataplus._M_p = (pointer)pCVar5->bitType;
          goto LAB_0031dfb9;
        }
        bVar2 = Type::isTypeRefType((Type *)compilation);
        if ((!bVar2) || (bVar2 = Type::isTypeRefType(pTVar6), !bVar2)) {
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
          Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
          goto LAB_0031ddaa;
        }
        local_100._M_dataplus._M_p = (pointer)pCVar5->bitType;
      }
      else {
        local_100._M_dataplus._M_p =
             (pointer)fromComponents::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)pCVar5,compilation,pTVar6,pTVar7);
      }
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
      (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    }
    else {
      local_100._M_dataplus._M_p = (pointer)pCVar5->bitType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
      (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->left_,pCVar5->stringType,
                 (SourceLocation)0x0);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->right_,pCVar5->stringType,
                 (SourceLocation)0x0);
    }
    if (BVar1 < WildcardEquality) {
      return &expr->super_Expression;
    }
    goto LAB_0031ddaa;
  case GreaterThanEqual:
  case GreaterThan:
  case LessThanEqual:
  case LessThan:
    local_d0 = lhs;
    local_100._M_dataplus._M_p =
         (pointer)fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)pCVar5,compilation,pTVar6,pTVar7);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    if (bVar4 == true && bVar3 == false) {
      pTVar7 = pCVar5->stringType;
    }
    else {
      pTVar7 = Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,false,false);
    }
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar7,(SourceLocation)0x0);
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar7,(SourceLocation)0x0);
    lhs = local_d0;
    if (bVar3 != false || bVar4 != false) {
      return &expr->super_Expression;
    }
    goto LAB_0031ddaa;
  case LogicalAnd:
  case LogicalOr:
  case LogicalImplication:
  case LogicalEquivalence:
    local_100._M_dataplus._M_p =
         (pointer)fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)pCVar5,compilation,pTVar6,pTVar7);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
LAB_0031da00:
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    break;
  case LogicalShiftLeft:
  case LogicalShiftRight:
  case ArithmeticShiftLeft:
  case ArithmeticShiftRight:
    bVar3 = Type::isFourState(pTVar6);
    if (bVar3) {
      local_100._M_dataplus._M_p =
           (pointer)fromComponents::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)pCVar5,compilation,forceType);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    }
    else {
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,&lt);
    }
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    bVar3 = bVar2;
    break;
  case Power:
    bVar2 = Type::isFloating((Type *)compilation);
    if ((!bVar2) && (bVar2 = Type::isFloating(pTVar6), !bVar2)) {
      local_100._M_dataplus._M_p =
           (pointer)fromComponents::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)pCVar5,compilation,forceType_00);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
      (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
      goto LAB_0031da00;
    }
    local_100._M_dataplus._M_p =
         (pointer)Expression::binaryOperatorType(pCVar5,(Type *)compilation,pTVar6,false,false);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_120,(Type **)&local_100);
    (expr->super_Expression).type.ptr = (Type *)local_120._M_dataplus._M_p;
    pTVar7 = not_null<const_slang::ast::Type_*>::get(&(expr->super_Expression).type);
    Expression::contextDetermined
              ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar7,(SourceLocation)0x0);
  }
  if (bVar3 == false) {
LAB_0031ddaa:
    diag = ASTContext::addDiag((ASTContext *)sourceRange.startLoc,(DiagCode)0x1d0007,local_c8);
    diag_00 = ast::operator<<(diag,lt);
    ast::operator<<(diag_00,pTVar6);
    Diagnostic::operator<<(diag,(this->super_Expression).sourceRange);
    Diagnostic::operator<<(diag,lhs->sourceRange);
LAB_0031d882:
    expr = (BinaryExpression *)Expression::badExpr(pCVar5,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceLocation opLoc, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return binaryOperatorType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, *result->type);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : binaryOperatorType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, *nt);
            contextDetermined(context, result->right_, *nt);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, *nt);
                contextDetermined(context, result->right_, *nt);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, compilation.getStringType());
                    contextDetermined(context, result->right_, compilation.getStringType());
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opLoc);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}